

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idec_dec.c
# Opt level: O0

VP8StatusCode FinishDecoding(WebPIDecoder *idec)

{
  WebPDecBuffer *buffer;
  void *__dest;
  VP8StatusCode VVar1;
  undefined4 *in_RDI;
  VP8StatusCode status_1;
  VP8StatusCode status;
  WebPDecBuffer *output;
  WebPDecoderOptions *options;
  VP8StatusCode local_4;
  
  buffer = *(WebPDecBuffer **)(in_RDI + 0xc);
  __dest = *(void **)(in_RDI + 2);
  *in_RDI = 6;
  if (((buffer == (WebPDecBuffer *)0x0) || ((buffer->u).YUVA.y_stride == 0)) ||
     (local_4 = WebPFlipBuffer(buffer), local_4 == VP8_STATUS_OK)) {
    if (*(long *)(in_RDI + 0x76) != 0) {
      VVar1 = WebPCopyDecBufferPixels(output,_status_1);
      WebPFreeDecBuffer((WebPDecBuffer *)0x13eadd);
      if (VVar1 != VP8_STATUS_OK) {
        return VVar1;
      }
      memcpy(__dest,*(void **)(in_RDI + 0x76),0x78);
      *(undefined8 *)(in_RDI + 0x76) = 0;
    }
    local_4 = VP8_STATUS_OK;
  }
  return local_4;
}

Assistant:

WEBP_NODISCARD static VP8StatusCode FinishDecoding(WebPIDecoder* const idec) {
  const WebPDecoderOptions* const options = idec->params.options;
  WebPDecBuffer* const output = idec->params.output;

  idec->state = STATE_DONE;
  if (options != NULL && options->flip) {
    const VP8StatusCode status = WebPFlipBuffer(output);
    if (status != VP8_STATUS_OK) return status;
  }
  if (idec->final_output != NULL) {
    const VP8StatusCode status = WebPCopyDecBufferPixels(
        output, idec->final_output);  // do the slow-copy
    WebPFreeDecBuffer(&idec->output);
    if (status != VP8_STATUS_OK) return status;
    *output = *idec->final_output;
    idec->final_output = NULL;
  }
  return VP8_STATUS_OK;
}